

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::CuriosityChassis::CuriosityChassis
          (CuriosityChassis *this,string *name,CuriosityChassisType chassis_type,
          shared_ptr<chrono::ChMaterialSurface> *mat)

{
  int iVar1;
  ChColor local_2bc;
  ChQuaternion<double> local_2b0;
  ChVector<double> local_290;
  ChFrame<double> local_278;
  ChVector<double> local_1f0;
  ChVector<double> local_1d8;
  ChQuaternion<double> local_1c0;
  ChVector<double> local_1a0;
  ChFrame<double> local_188;
  ChVector<double> local_100;
  ChVector<double> local_e8;
  shared_ptr<chrono::ChMaterialSurface> local_c0;
  ChFrame<double> local_b0;
  shared_ptr<chrono::ChMaterialSurface> *local_28;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  string *psStack_18;
  CuriosityChassisType chassis_type_local;
  string *name_local;
  CuriosityChassis *this_local;
  
  local_28 = mat;
  mat_local._4_4_ = chassis_type;
  psStack_18 = name;
  name_local = (string *)this;
  ChFrame<double>::ChFrame(&local_b0,(ChVector<double> *)&VNULL,(ChQuaternion<double> *)&QUNIT);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_c0,mat);
  CuriosityPart::CuriosityPart(&this->super_CuriosityPart,name,&local_b0,&local_c0,false);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_c0);
  ChFrame<double>::~ChFrame(&local_b0);
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityChassis_002ee940;
  *(CuriosityChassisType *)&(this->super_CuriosityPart).field_0x234 = mat_local._4_4_;
  iVar1 = *(int *)&(this->super_CuriosityPart).field_0x234;
  if (iVar1 == 0) {
    (this->super_CuriosityPart).m_mass = 750.0;
    ChVector<double>::ChVector(&local_100,0.85,0.85,1.0);
    ChVector<double>::operator*(&local_e8,&local_100,(this->super_CuriosityPart).m_mass);
    ChVector<double>::operator=(&(this->super_CuriosityPart).m_inertia,&local_e8);
    ChVector<double>::ChVector(&local_1a0,0.0,0.0,0.0);
    ChQuaternion<double>::ChQuaternion(&local_1c0,1.0,0.0,0.0,0.0);
    ChFrame<double>::ChFrame(&local_188,&local_1a0,&local_1c0);
    ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_188);
    ChFrame<double>::~ChFrame(&local_188);
    std::__cxx11::string::operator=
              ((string *)&(this->super_CuriosityPart).m_mesh_name,"curiosity_chassis");
  }
  else if (iVar1 == 1) {
    (this->super_CuriosityPart).m_mass = 200.0;
    ChVector<double>::ChVector(&local_1f0,0.4,0.4,0.5);
    ChVector<double>::operator*(&local_1d8,&local_1f0,(this->super_CuriosityPart).m_mass);
    ChVector<double>::operator=(&(this->super_CuriosityPart).m_inertia,&local_1d8);
    ChVector<double>::ChVector(&local_290,0.0,0.0,0.0);
    ChQuaternion<double>::ChQuaternion(&local_2b0,1.0,0.0,0.0,0.0);
    ChFrame<double>::ChFrame(&local_278,&local_290,&local_2b0);
    ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_278);
    ChFrame<double>::~ChFrame(&local_278);
    std::__cxx11::string::operator=
              ((string *)&(this->super_CuriosityPart).m_mesh_name,"scarecrow_chassis");
  }
  ChColor::ChColor(&local_2bc,1.0,1.0,1.0);
  ChColor::operator=(&(this->super_CuriosityPart).m_color,&local_2bc);
  return;
}

Assistant:

CuriosityChassis::CuriosityChassis(const std::string& name,
                                   CuriosityChassisType chassis_type,
                                   std::shared_ptr<ChMaterialSurface> mat)
    : CuriosityPart(name, ChFrame<>(VNULL, QUNIT), mat, false), m_chassis_type(chassis_type) {
    switch (m_chassis_type) {
        case CuriosityChassisType::FullRover:
            m_mass = 750;
            m_inertia = ChVector<>(0.85, 0.85, 1.0) * m_mass;
            m_cog = ChFrame<>();
            m_mesh_name = "curiosity_chassis";
            break;

        case CuriosityChassisType::Scarecrow:
            m_mass = 200;
            m_inertia = ChVector<>(0.4, 0.4, 0.5) * m_mass;
            m_cog = ChFrame<>();
            m_mesh_name = "scarecrow_chassis";
            break;
    }
    m_color = ChColor(1.0f, 1.0f, 1.0f);
}